

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O3

uint __thiscall
xercesc_4_0::NamespaceScope::getNamespaceForPrefix(NamespaceScope *this,XMLCh *prefixToMap)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  bool bVar3;
  ulong uVar4;
  XMLCh *pXVar5;
  uint *puVar6;
  XMLCh XVar7;
  ulong uVar8;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar9;
  
  pRVar2 = (this->fPrefixPool).fHashTable;
  if ((prefixToMap == (XMLCh *)0x0) || (uVar4 = (ulong)(ushort)*prefixToMap, uVar4 == 0)) {
    uVar4 = 0;
  }
  else {
    XVar7 = prefixToMap[1];
    if (XVar7 != L'\0') {
      pXVar5 = prefixToMap + 2;
      do {
        uVar4 = (ulong)(ushort)XVar7 + (uVar4 >> 0x18) + uVar4 * 0x26;
        XVar7 = *pXVar5;
        pXVar5 = pXVar5 + 1;
      } while (XVar7 != L'\0');
    }
    uVar4 = uVar4 % pRVar2->fHashModulus;
  }
  pRVar9 = pRVar2->fBucketList[uVar4];
  if (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,prefixToMap,pRVar9->fKey);
      if (bVar3) {
        if (((pRVar9->fData != (PoolElem *)0x0) && (uVar1 = pRVar9->fData->fId, uVar1 != 0)) &&
           (uVar4 = (ulong)this->fStackTop, uVar4 != 0)) {
          do {
            uVar8 = (ulong)this->fStack[uVar4 - 1]->fMapCount;
            if (uVar8 != 0) {
              puVar6 = &this->fStack[uVar4 - 1]->fMap->fURIId;
              do {
                if (((PrefMapElem *)(puVar6 + -1))->fPrefId == uVar1) goto LAB_00312f64;
                puVar6 = puVar6 + 2;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        break;
      }
      pRVar9 = pRVar9->fNext;
    } while (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  puVar6 = &this->fEmptyNamespaceId;
LAB_00312f64:
  return *puVar6;
}

Assistant:

unsigned int
NamespaceScope::getNamespaceForPrefix(const XMLCh* const prefixToMap) const {

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);

    if (!prefixId){
        return fEmptyNamespaceId;
    }

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (unsigned int index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // If no prefixes mapped at this level, then go the next one
        if (!curRow->fMapCount)
            continue;

        // Search the map at this level for the passed prefix
        for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }

    return fEmptyNamespaceId;
}